

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O3

void __thiscall QRhiResourceUpdateBatch::~QRhiResourceUpdateBatch(QRhiResourceUpdateBatch *this)

{
  QRhiResourceUpdateBatchPrivate *pQVar1;
  long lVar2;
  QRhiBufferData *this_00;
  undefined1 *puVar3;
  ulong uVar4;
  
  pQVar1 = this->d;
  if (pQVar1 != (QRhiResourceUpdateBatchPrivate *)0x0) {
    std::_Destroy_n_aux<false>::__destroy_n<QRhiResourceUpdateBatchPrivate::TextureOp*,long_long>
              ((TextureOp *)
               (pQVar1->textureOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::TextureOp>.
               super_QVLABaseBase.ptr,
               (pQVar1->textureOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::TextureOp>.
               super_QVLABaseBase.s);
    puVar3 = (undefined1 *)
             (pQVar1->textureOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::TextureOp>.
             super_QVLABaseBase.ptr;
    if ((QVLAStorage<2432UL,_8UL,_32LL> *)puVar3 !=
        &(pQVar1->textureOps).super_QVLAStorage<2432UL,_8UL,_32LL>) {
      QtPrivate::sizedFree
                (puVar3,(pQVar1->textureOps).
                        super_QVLABase<QRhiResourceUpdateBatchPrivate::TextureOp>.super_QVLABaseBase
                        .a * 0x980);
    }
    lVar2 = (pQVar1->bufferOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>.
            super_QVLABaseBase.s;
    puVar3 = (undefined1 *)
             (pQVar1->bufferOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>.
             super_QVLABaseBase.ptr;
    if (0 < lVar2) {
      uVar4 = lVar2 + 1;
      this_00 = (QRhiBufferData *)(puVar3 + 0x18);
      do {
        QRhiBufferData::~QRhiBufferData(this_00);
        uVar4 = uVar4 - 1;
        this_00 = this_00 + 6;
      } while (1 < uVar4);
      puVar3 = (undefined1 *)
               (pQVar1->bufferOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>.
               super_QVLABaseBase.ptr;
    }
    if ((QVLAStorage<48UL,_8UL,_64LL> *)puVar3 !=
        &(pQVar1->bufferOps).super_QVLAStorage<48UL,_8UL,_64LL>) {
      QtPrivate::sizedFree
                (puVar3,(pQVar1->bufferOps).super_QVLABase<QRhiResourceUpdateBatchPrivate::BufferOp>
                        .super_QVLABaseBase.a * 0x30);
    }
  }
  operator_delete(pQVar1,0x13c58);
  return;
}

Assistant:

QRhiResourceUpdateBatch::~QRhiResourceUpdateBatch()
{
    delete d;
}